

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iirdemo.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double dVar1;
  double dVar2;
  FILE *pFVar3;
  long lVar4;
  int iVar5;
  double *pdVar6;
  double (*paadVar7) [2] [6];
  byte bVar8;
  uint uVar9;
  Biquad *pBVar10;
  HighPass hp;
  double coeff [2] [6];
  SOSCascade<2,_Iir::DirectFormII> cust;
  double coeff2 [3] [6];
  LowPass<8,_Iir::DirectFormII> lp_cheby1;
  SOSCascade<3,_Iir::DirectFormII> cust2;
  LowPass<8,_Iir::DirectFormII> f;
  BandStop<4,_Iir::DirectFormII> bsn;
  HighPass<8,_Iir::DirectFormII> hp_cheby2;
  
  bVar8 = 0;
  Iir::PoleFilter<Iir::Butterworth::LowPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter
            (&f.super_PoleFilter<Iir::Butterworth::LowPassBase,_Iir::DirectFormII,_8,_8>);
  Iir::Butterworth::LowPassBase::setup
            (&f.super_PoleFilter<Iir::Butterworth::LowPassBase,_Iir::DirectFormII,_8,_8>.
              super_LowPassBase,8,0.1);
  pFVar3 = fopen("lp.dat","wt");
  iVar5 = 1000;
  while (iVar5 != 0) {
    uVar9 = 0x3ff00000;
    if (iVar5 != 0x3de) {
      uVar9 = 0;
    }
    dVar1 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                      (&f.super_PoleFilter<Iir::Butterworth::LowPassBase,_Iir::DirectFormII,_8,_8>.
                        super_CascadeStages<4,_Iir::DirectFormII>,(double)((ulong)uVar9 << 0x20));
    fprintf(pFVar3,"%e\n",SUB84(dVar1,0));
    iVar5 = iVar5 + -1;
  }
  fclose(pFVar3);
  pFVar3 = fopen("lpf.dat","wt");
  for (dVar1 = 0.0; pBVar10 = (Biquad *)0x3fe0000000000000, dVar1 < 0.5; dVar1 = dVar1 + 0.01) {
    Iir::Cascade::response((Cascade *)&f,dVar1);
    lp_cheby1.super_PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>.
    super_LowPassBase.super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.super_PoleFilterBase2.
    super_Cascade.m_stageArray = pBVar10;
    dVar2 = std::abs<double>((complex<double> *)&lp_cheby1);
    fprintf(pFVar3,"%e\t%e\n",SUB84(dVar1,0),dVar2);
  }
  fclose(pFVar3);
  hp.super_RBJbase.super_Biquad.m_a0 = 1.0;
  hp.super_RBJbase.super_Biquad.m_a1 = 0.0;
  hp.super_RBJbase.super_Biquad.m_a2 = 0.0;
  hp.super_RBJbase.super_Biquad.m_b1 = 0.0;
  hp.super_RBJbase.super_Biquad.m_b2 = 0.0;
  hp.super_RBJbase.super_Biquad.m_b0 = 1.0;
  hp.super_RBJbase.state.m_x2 = 0.0;
  hp.super_RBJbase.state.m_y2 = 0.0;
  hp.super_RBJbase.state.m_x1 = 0.0;
  hp.super_RBJbase.state.m_y1 = 0.0;
  Iir::RBJ::HighPass::setupN((HighPass *)&hp.super_RBJbase,0.1,5.0);
  pFVar3 = fopen("hp_rbj.dat","wt");
  iVar5 = 1000;
  while (iVar5 != 0) {
    uVar9 = 0x3ff00000;
    if (iVar5 != 0x3de) {
      uVar9 = 0;
    }
    dVar1 = Iir::RBJ::RBJbase::filter<double>(&hp.super_RBJbase,(double)((ulong)uVar9 << 0x20));
    fprintf(pFVar3,"%e\n",SUB84(dVar1,0));
    iVar5 = iVar5 + -1;
  }
  fclose(pFVar3);
  Iir::PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter
            (&lp_cheby1.super_PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>);
  Iir::ChebyshevI::LowPassBase::setup
            (&lp_cheby1.super_PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>.
              super_LowPassBase,8,0.1,1.0);
  pFVar3 = fopen("lp_cheby1.dat","wt");
  iVar5 = 1000;
  while (iVar5 != 0) {
    uVar9 = 0x3ff00000;
    if (iVar5 != 0x3de) {
      uVar9 = 0;
    }
    dVar1 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                      (&lp_cheby1.
                        super_PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>.
                        super_CascadeStages<4,_Iir::DirectFormII>,(double)((ulong)uVar9 << 0x20));
    fprintf(pFVar3,"%e\n",SUB84(dVar1,0));
    iVar5 = iVar5 + -1;
  }
  fclose(pFVar3);
  Iir::PoleFilter<Iir::ChebyshevII::HighPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter
            (&hp_cheby2.super_PoleFilter<Iir::ChebyshevII::HighPassBase,_Iir::DirectFormII,_8,_8>);
  Iir::ChebyshevII::HighPass<8,_Iir::DirectFormII>::setupN
            ((HighPass<8,_Iir::DirectFormII> *)
             &hp_cheby2.super_PoleFilter<Iir::ChebyshevII::HighPassBase,_Iir::DirectFormII,_8,_8>,
             0.1,60.0);
  pFVar3 = fopen("hp_cheby2.dat","wt");
  iVar5 = 1000;
  while (iVar5 != 0) {
    uVar9 = 0x3ff00000;
    if (iVar5 != 0x3de) {
      uVar9 = 0;
    }
    dVar1 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                      (&hp_cheby2.
                        super_PoleFilter<Iir::ChebyshevII::HighPassBase,_Iir::DirectFormII,_8,_8>.
                        super_CascadeStages<4,_Iir::DirectFormII>,(double)((ulong)uVar9 << 0x20));
    fprintf(pFVar3,"%e\n",SUB84(dVar1,0));
    iVar5 = iVar5 + -1;
  }
  fclose(pFVar3);
  Iir::PoleFilter<Iir::Butterworth::BandStopBase,_Iir::DirectFormII,_4,_8>::PoleFilter
            (&bsn.super_PoleFilter<Iir::Butterworth::BandStopBase,_Iir::DirectFormII,_4,_8>);
  Iir::Butterworth::BandStop<4,_Iir::DirectFormII>::setupN
            ((BandStop<4,_Iir::DirectFormII> *)
             &bsn.super_PoleFilter<Iir::Butterworth::BandStopBase,_Iir::DirectFormII,_4,_8>,0.1,0.01
            );
  pFVar3 = fopen("bs_norm.dat","wt");
  iVar5 = 1000;
  while (iVar5 != 0) {
    uVar9 = 0x3ff00000;
    if (iVar5 != 0x3de) {
      uVar9 = 0;
    }
    dVar1 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                      (&bsn.
                        super_PoleFilter<Iir::Butterworth::BandStopBase,_Iir::DirectFormII,_4,_8>.
                        super_CascadeStages<4,_Iir::DirectFormII>,(double)((ulong)uVar9 << 0x20));
    fprintf(pFVar3,"%e\n",SUB84(dVar1,0));
    iVar5 = iVar5 + -1;
  }
  fclose(pFVar3);
  pdVar6 = (double *)&DAT_00108100;
  paadVar7 = &coeff;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    (*paadVar7)[0][0] = *pdVar6;
    pdVar6 = pdVar6 + (ulong)bVar8 * -2 + 1;
    paadVar7 = (double (*) [2] [6])((long)paadVar7 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  Iir::Custom::SOSCascade<2,_Iir::DirectFormII>::SOSCascade
            ((SOSCascade<2,_Iir::DirectFormII> *)&cust.super_CascadeStages<2,_Iir::DirectFormII>,
             &coeff);
  pFVar3 = fopen("ellip.dat","wt");
  iVar5 = 1000;
  while (iVar5 != 0) {
    uVar9 = 0x3ff00000;
    if (iVar5 != 0x3de) {
      uVar9 = 0;
    }
    dVar1 = Iir::CascadeStages<2,_Iir::DirectFormII>::filter<double>
                      (&cust.super_CascadeStages<2,_Iir::DirectFormII>,
                       (double)((ulong)uVar9 << 0x20));
    fprintf(pFVar3,"%e\n",SUB84(dVar1,0));
    iVar5 = iVar5 + -1;
  }
  fclose(pFVar3);
  memcpy(&coeff2,&DAT_00108160,0x90);
  Iir::Custom::SOSCascade<3,_Iir::DirectFormII>::SOSCascade
            ((SOSCascade<3,_Iir::DirectFormII> *)&cust2.super_CascadeStages<3,_Iir::DirectFormII>,
             &coeff2);
  pFVar3 = fopen("bessel.dat","wt");
  iVar5 = 1000;
  while (iVar5 != 0) {
    uVar9 = 0x3ff00000;
    if (iVar5 != 0x3de) {
      uVar9 = 0;
    }
    dVar1 = Iir::CascadeStages<3,_Iir::DirectFormII>::filter<double>
                      (&cust2.super_CascadeStages<3,_Iir::DirectFormII>,
                       (double)((ulong)uVar9 << 0x20));
    fprintf(pFVar3,"%e\n",SUB84(dVar1,0));
    iVar5 = iVar5 + -1;
  }
  fclose(pFVar3);
  puts("finished!");
  puts("Now run `plot_impulse_fresponse.py` to display the impulse/frequency responses.");
  return 0;
}

Assistant:

int main(int, char**)
{
	const int order = 8;

	// sampling rate here 1kHz as an example
	const float samplingrate = 1000;

	FILE *fimpulse = NULL;

	// Butterworth lowpass
	Iir::Butterworth::LowPass<order> f;
	double cutoff_frequency = 100; // Hz
	f.setup(samplingrate, cutoff_frequency);
	fimpulse = fopen("lp.dat", "wt");
	// let's simulated date streaming in
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = f.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);
	FILE* fresp = fopen("lpf.dat", "wt");
	for(double fr=0.0;fr<0.5;fr=fr+0.01) {
		auto r = f.response(fr);
		fprintf(fresp,"%e\t%e\n",fr,abs(r));
	}
	fclose(fresp);

	// RBJ highpass filter
	// The Q factor determines the resonance at the
	// cutoff frequency. If Q=1/sqrt(2) then the transition
	// has no resonance. The higher the Q-factor the higher
	// the resonance.
	Iir::RBJ::HighPass hp;
	const double hp_cutoff_frequency = 100;
	const double hp_qfactor = 5;
	hp.setup(samplingrate, hp_cutoff_frequency, hp_qfactor);
	fimpulse = fopen("hp_rbj.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = hp.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	Iir::ChebyshevI::LowPass<8> lp_cheby1;
	const float pass_ripple_db2 = 1; // dB
	lp_cheby1.setup(samplingrate,
		cutoff_frequency,
		pass_ripple_db2);
	fimpulse = fopen("lp_cheby1.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = lp_cheby1.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	// Demo here if one has a pure digital
	// system one can use normalised
	// frequencies from 0 to 1/2 (Nyquist)
	// where the frequency is 1/samples.
	Iir::ChebyshevII::HighPass<order> hp_cheby2;
	double stop_ripple_dB = 60;
	// Setting cutoff to normalised f=0.1
	double normalised_cutoff_freq = 0.1;
	hp_cheby2.setupN(normalised_cutoff_freq,
		stop_ripple_dB);
	fimpulse = fopen("hp_cheby2.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = hp_cheby2.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	// Bandstop filter with default order
	Iir::Butterworth::BandStop<> bsn;
	const double norm_center_frequency = 0.1;
	const double norm_frequency_width = 0.01;
	bsn.setupN(norm_center_frequency, norm_frequency_width);
	fimpulse = fopen("bs_norm.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = bsn.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);

	// generated with: "elliptic_design.py"
	const double coeff[][6] = {
		{1.665623674062209972e-02,
		 -3.924801366970616552e-03,
		 1.665623674062210319e-02,
		 1.000000000000000000e+00,
		 -1.715403014004022175e+00,
		 8.100474793174089472e-01},
		{1.000000000000000000e+00,
		 -1.369778997100624895e+00,
		 1.000000000000000222e+00,
		 1.000000000000000000e+00,
		 -1.605878925999785656e+00,
		 9.538657786383895054e-01}
	};
	const int nSOS = sizeof(coeff) / sizeof(coeff[0]);
	Iir::Custom::SOSCascade<nSOS> cust(coeff);
	fimpulse = fopen("ellip.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = cust.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);



	// generated with: "bessel_design.py"
	const double coeff2[][6] = {
{2.920503346420688542e-04,5.841006692841377084e-04,2.920503346420688542e-04,1.000000000000000000e+00,-1.080977903549440899e+00,2.972760361591921807e-01},
{1.000000000000000000e+00,2.000000000000000000e+00,1.000000000000000000e+00,1.000000000000000000e+00,-1.109677060197390652e+00,3.586665760324884156e-01},
{1.000000000000000000e+00,2.000000000000000000e+00,1.000000000000000000e+00,1.000000000000000000e+00,-1.179438547708672624e+00,5.264979795433866183e-01},
	};
	const int nSOS2 = sizeof(coeff2) / sizeof(coeff2[0]);
	Iir::Custom::SOSCascade<nSOS2> cust2(coeff2);
	fimpulse = fopen("bessel.dat", "wt");
	for (int i = 0; i < 1000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		double b = cust2.filter(a);
		fprintf(fimpulse, "%e\n", b);
	}
	fclose(fimpulse);



	printf("finished!\n");
	printf("Now run `plot_impulse_fresponse.py` to display the impulse/frequency responses.\n");
}